

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O1

void ihevc_intra_pred_luma_mode_3_to_9_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [14];
  undefined1 auVar68 [12];
  unkbyte10 Var69;
  undefined1 auVar70 [14];
  undefined1 auVar71 [12];
  unkbyte10 Var72;
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  undefined1 auVar76 [14];
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  unkbyte9 Var82;
  unkbyte9 Var83;
  undefined6 uVar84;
  undefined2 uVar85;
  undefined6 uVar86;
  undefined4 uVar87;
  undefined2 uVar88;
  UWORD8 aUVar89 [16];
  long lVar90;
  UWORD8 *pUVar91;
  UWORD8 *pUVar92;
  UWORD8 *pUVar93;
  ulong uVar94;
  ulong uVar95;
  short sVar96;
  short sVar97;
  undefined4 uVar98;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar118;
  short sVar120;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  short sVar112;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  short sVar113;
  short sVar117;
  short sVar119;
  short sVar121;
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined2 uVar122;
  undefined4 uVar123;
  undefined4 uVar151;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined4 uVar152;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined2 uVar153;
  undefined4 uVar154;
  undefined1 in_XMM2 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  short sVar172;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined4 uVar173;
  undefined1 auVar176 [12];
  undefined1 in_XMM3 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined4 uVar174;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [12];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined4 uVar201;
  undefined1 auVar203 [12];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  short sVar227;
  short sVar228;
  short sVar229;
  short sVar230;
  short sVar231;
  undefined1 in_XMM7 [16];
  short sVar232;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  short local_68;
  short sStack_66;
  undefined1 auVar99 [12];
  undefined1 auVar110 [16];
  undefined6 uVar124;
  undefined1 auVar136 [16];
  undefined1 auVar126 [12];
  undefined1 auVar145 [16];
  undefined8 uVar125;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar146 [16];
  undefined1 auVar127 [12];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar147 [16];
  undefined1 auVar128 [14];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar150 [16];
  undefined6 uVar155;
  undefined1 auVar157 [12];
  undefined8 uVar156;
  undefined1 auVar158 [12];
  undefined1 auVar170 [16];
  undefined1 auVar164 [16];
  undefined1 auVar159 [14];
  undefined1 auVar171 [16];
  undefined1 auVar168 [16];
  undefined1 auVar175 [12];
  undefined1 auVar181 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar182 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar190 [14];
  undefined1 auVar200 [16];
  undefined1 auVar194 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar202 [12];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar204 [14];
  undefined1 auVar216 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  
  aUVar89 = IHEVCE_SHUFFLEMASKY11;
  uVar1 = gai4_ihevc_ang_table[mode];
  if ((nt == 0x20) || (nt == 0x10)) {
    if (0 < nt) {
      auVar177 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0);
      auVar130 = pshuflw(ZEXT416((uint)nt),ZEXT416((uint)nt),0);
      sVar96 = auVar130._0_2_;
      sVar112 = auVar130._2_2_;
      lVar90 = (long)dst_strd;
      pUVar91 = pu1_dst + lVar90 * 7;
      auVar130 = pmovsxbw(in_XMM2,0x807060504030201);
      uVar94 = 0;
      auVar205 = pmovsxbw(in_XMM7,0x1010101010101010);
      do {
        sVar97 = auVar130._0_2_;
        sVar113 = auVar130._4_2_;
        sVar116 = auVar130._6_2_;
        sVar118 = auVar130._8_2_;
        sVar114 = auVar130._10_2_;
        sVar115 = auVar130._12_2_;
        sVar172 = auVar130._14_2_;
        local_68 = auVar177._0_2_;
        sStack_66 = auVar177._2_2_;
        auVar178._0_2_ = sVar97 * local_68;
        auVar178._2_2_ = auVar130._2_2_ * sStack_66;
        auVar178._4_2_ = sVar113 * local_68;
        auVar178._6_2_ = sVar116 * sStack_66;
        auVar178._8_2_ = sVar118 * local_68;
        auVar178._10_2_ = sVar114 * sStack_66;
        auVar178._12_2_ = sVar115 * local_68;
        auVar178._14_2_ = sVar172 * sStack_66;
        auVar223 = psraw(auVar178,5);
        auVar178 = auVar178 & _DAT_00172230;
        auVar191 = pmovsxbw(auVar223,0x2020202020202020);
        auVar195._0_2_ = auVar191._0_2_ - auVar178._0_2_;
        auVar195._2_2_ = auVar191._2_2_ - auVar178._2_2_;
        auVar195._4_2_ = auVar191._4_2_ - auVar178._4_2_;
        auVar195._6_2_ = auVar191._6_2_ - auVar178._6_2_;
        auVar195._8_2_ = auVar191._8_2_ - auVar178._8_2_;
        auVar195._10_2_ = auVar191._10_2_ - auVar178._10_2_;
        auVar195._12_2_ = auVar191._12_2_ - auVar178._12_2_;
        auVar195._14_2_ = auVar191._14_2_ - auVar178._14_2_;
        auVar222 = psllw(auVar195,8);
        auVar222 = auVar222 | auVar195;
        auVar195 = psllw(auVar178,8);
        auVar195 = auVar195 | auVar178;
        uVar123 = CONCAT13(auVar195[9],CONCAT12(auVar222[9],CONCAT11(auVar195[8],auVar222[8])));
        auVar126._0_8_ =
             CONCAT17(auVar195[0xb],
                      CONCAT16(auVar222[0xb],CONCAT15(auVar195[10],CONCAT14(auVar222[10],uVar123))))
        ;
        auVar126[8] = auVar222[0xc];
        auVar126[9] = auVar195[0xc];
        auVar126[10] = auVar222[0xd];
        auVar126[0xb] = auVar195[0xd];
        auVar191[0xc] = auVar222[0xe];
        auVar191._0_12_ = auVar126;
        auVar191[0xd] = auVar195[0xe];
        auVar191[0xe] = auVar222[0xf];
        auVar191[0xf] = auVar195[0xf];
        auVar225._0_14_ = auVar222._0_14_;
        auVar225[0xe] = auVar222[7];
        auVar225[0xf] = auVar195[7];
        auVar182._14_2_ = auVar225._14_2_;
        auVar182._0_13_ = auVar222._0_13_;
        auVar182[0xd] = auVar195[6];
        auVar181._13_3_ = auVar182._13_3_;
        auVar181._0_12_ = auVar222._0_12_;
        auVar181[0xc] = auVar222[6];
        auVar180._12_4_ = auVar181._12_4_;
        auVar180._0_11_ = auVar222._0_11_;
        auVar180[0xb] = auVar195[5];
        auVar235._11_5_ = auVar180._11_5_;
        auVar235._0_10_ = auVar222._0_10_;
        auVar235[10] = auVar222[5];
        auVar234._10_6_ = auVar235._10_6_;
        auVar234._0_9_ = auVar222._0_9_;
        auVar234[9] = auVar195[4];
        auVar249._9_7_ = auVar234._9_7_;
        auVar249._0_8_ = auVar222._0_8_;
        auVar249[8] = auVar222[4];
        auVar66._4_8_ = auVar249._8_8_;
        auVar66[3] = auVar195[3];
        auVar66[2] = auVar222[3];
        auVar66[1] = auVar195[2];
        auVar66[0] = auVar222[2];
        auVar246._4_12_ = auVar66;
        auVar246[3] = auVar195[1];
        auVar246[2] = auVar222[1];
        auVar246[0] = auVar222[0];
        auVar246[1] = auVar195[0];
        uVar173 = auVar246._0_4_;
        uVar151 = auVar66._0_4_;
        uVar98 = auVar249._8_4_;
        auVar222._4_4_ = uVar151;
        auVar222._0_4_ = uVar151;
        auVar222._8_4_ = uVar151;
        auVar222._12_4_ = uVar151;
        auVar248._4_4_ = uVar98;
        auVar248._0_4_ = uVar98;
        auVar248._8_4_ = uVar98;
        auVar248._12_4_ = uVar98;
        uVar151 = (undefined4)((ulong)auVar126._0_8_ >> 0x20);
        uVar98 = auVar126._8_4_;
        uVar152 = auVar191._12_4_;
        uVar95 = 0;
        pUVar92 = pUVar91;
        pUVar93 = pu1_ref;
        do {
          auVar178 = pshufb(*(undefined1 (*) [16])
                             (pUVar93 + (long)(short)(sVar96 * 2 - auVar223._0_2_) + -9),
                            (undefined1  [16])aUVar89);
          auVar61._4_4_ = uVar173;
          auVar61._0_4_ = uVar173;
          auVar61._8_4_ = uVar173;
          auVar61._12_4_ = uVar173;
          auVar178 = pmaddubsw(auVar178,auVar61);
          auVar191 = pshufb(*(undefined1 (*) [16])
                             (pUVar93 + (long)(short)(sVar96 * 2 - auVar223._4_2_) + -9),
                            (undefined1  [16])aUVar89);
          auVar191 = pmaddubsw(auVar191,auVar248);
          sVar119 = auVar205._0_2_;
          auVar193._0_2_ = auVar178._0_2_ + sVar119;
          sVar227 = auVar205._2_2_;
          auVar193._2_2_ = auVar178._2_2_ + sVar227;
          sVar121 = auVar205._4_2_;
          auVar193._4_2_ = auVar178._4_2_ + sVar121;
          sVar228 = auVar205._6_2_;
          auVar193._6_2_ = auVar178._6_2_ + sVar228;
          sVar229 = auVar205._8_2_;
          auVar193._8_2_ = auVar178._8_2_ + sVar229;
          sVar230 = auVar205._10_2_;
          auVar193._10_2_ = auVar178._10_2_ + sVar230;
          sVar231 = auVar205._12_2_;
          auVar193._12_2_ = auVar178._12_2_ + sVar231;
          sVar232 = auVar205._14_2_;
          auVar193._14_2_ = auVar178._14_2_ + sVar232;
          auVar233._0_2_ = auVar191._0_2_ + sVar119;
          auVar233._2_2_ = auVar191._2_2_ + sVar227;
          auVar233._4_2_ = auVar191._4_2_ + sVar121;
          auVar233._6_2_ = auVar191._6_2_ + sVar228;
          auVar233._8_2_ = auVar191._8_2_ + sVar229;
          auVar233._10_2_ = auVar191._10_2_ + sVar230;
          auVar233._12_2_ = auVar191._12_2_ + sVar231;
          auVar233._14_2_ = auVar191._14_2_ + sVar232;
          auVar225 = psraw(auVar193,5);
          auVar234 = psraw(auVar233,5);
          sVar4 = auVar225._0_2_;
          sVar5 = auVar225._2_2_;
          sVar6 = auVar225._4_2_;
          sVar8 = auVar225._6_2_;
          sVar10 = auVar225._8_2_;
          sVar14 = auVar225._10_2_;
          sVar18 = auVar225._12_2_;
          sVar117 = auVar225._14_2_;
          cVar2 = (0 < sVar117) * (sVar117 < 0x100) * auVar225[0xe] - (0xff < sVar117);
          sVar24 = auVar234._0_2_;
          sVar28 = auVar234._2_2_;
          sVar32 = auVar234._4_2_;
          sVar37 = auVar234._6_2_;
          sVar45 = auVar234._8_2_;
          sVar53 = auVar234._10_2_;
          sVar40 = auVar234._12_2_;
          sVar48 = auVar234._14_2_;
          auVar178 = pshufb(*(undefined1 (*) [16])
                             (pUVar93 + (long)(short)(sVar112 * 2 - auVar223._2_2_) + -9),
                            (undefined1  [16])aUVar89);
          auVar249 = pmaddubsw(auVar178,auVar222);
          auVar178 = pshufb(*(undefined1 (*) [16])
                             (pUVar93 + (long)(short)(sVar112 * 2 - auVar223._6_2_) + -9),
                            (undefined1  [16])aUVar89);
          auVar56._4_4_ = auVar180._12_4_;
          auVar56._0_4_ = auVar180._12_4_;
          auVar56._8_4_ = auVar180._12_4_;
          auVar56._12_4_ = auVar180._12_4_;
          auVar195 = pmaddubsw(auVar178,auVar56);
          auVar178 = pshufb(*(undefined1 (*) [16])
                             (pUVar93 + (long)(short)(sVar96 * 2 - auVar223._8_2_) + -9),
                            (undefined1  [16])aUVar89);
          auVar57._4_4_ = uVar123;
          auVar57._0_4_ = uVar123;
          auVar57._8_4_ = uVar123;
          auVar57._12_4_ = uVar123;
          auVar246 = pmaddubsw(auVar178,auVar57);
          auVar178 = pshufb(*(undefined1 (*) [16])
                             (pUVar93 + (long)(short)(sVar112 * 2 - auVar223._10_2_) + -9),
                            (undefined1  [16])aUVar89);
          auVar58._4_4_ = uVar151;
          auVar58._0_4_ = uVar151;
          auVar58._8_4_ = uVar151;
          auVar58._12_4_ = uVar151;
          auVar178 = pmaddubsw(auVar178,auVar58);
          auVar191 = pshufb(*(undefined1 (*) [16])
                             (pUVar93 + (long)(short)(sVar96 * 2 - auVar223._12_2_) + -9),
                            (undefined1  [16])aUVar89);
          auVar59._4_4_ = uVar98;
          auVar59._0_4_ = uVar98;
          auVar59._8_4_ = uVar98;
          auVar59._12_4_ = uVar98;
          auVar191 = pmaddubsw(auVar191,auVar59);
          auVar235 = pshufb(*(undefined1 (*) [16])
                             (pUVar93 + (long)(short)(sVar112 * 2 - auVar223._14_2_) + -9),
                            (undefined1  [16])aUVar89);
          auVar60._4_4_ = uVar152;
          auVar60._0_4_ = uVar152;
          auVar60._8_4_ = uVar152;
          auVar60._12_4_ = uVar152;
          auVar235 = pmaddubsw(auVar235,auVar60);
          auVar218._0_2_ = auVar249._0_2_ + sVar119;
          auVar218._2_2_ = auVar249._2_2_ + sVar227;
          auVar218._4_2_ = auVar249._4_2_ + sVar121;
          auVar218._6_2_ = auVar249._6_2_ + sVar228;
          auVar218._8_2_ = auVar249._8_2_ + sVar229;
          auVar218._10_2_ = auVar249._10_2_ + sVar230;
          auVar218._12_2_ = auVar249._12_2_ + sVar231;
          auVar218._14_2_ = auVar249._14_2_ + sVar232;
          auVar183._0_2_ = auVar195._0_2_ + sVar119;
          auVar183._2_2_ = auVar195._2_2_ + sVar227;
          auVar183._4_2_ = auVar195._4_2_ + sVar121;
          auVar183._6_2_ = auVar195._6_2_ + sVar228;
          auVar183._8_2_ = auVar195._8_2_ + sVar229;
          auVar183._10_2_ = auVar195._10_2_ + sVar230;
          auVar183._12_2_ = auVar195._12_2_ + sVar231;
          auVar183._14_2_ = auVar195._14_2_ + sVar232;
          auVar249 = psraw(auVar218,5);
          auVar195 = psraw(auVar183,5);
          sVar117 = auVar249._0_2_;
          sVar120 = auVar249._2_2_;
          sVar7 = auVar249._4_2_;
          sVar9 = auVar249._6_2_;
          sVar11 = auVar249._8_2_;
          sVar15 = auVar249._10_2_;
          sVar19 = auVar249._12_2_;
          sVar22 = auVar249._14_2_;
          sVar25 = auVar195._0_2_;
          sVar29 = auVar195._2_2_;
          sVar33 = auVar195._4_2_;
          sVar38 = auVar195._6_2_;
          sVar46 = auVar195._8_2_;
          sVar54 = auVar195._10_2_;
          sVar41 = auVar195._12_2_;
          sVar49 = auVar195._14_2_;
          auVar214._0_2_ = auVar246._0_2_ + sVar119;
          auVar214._2_2_ = auVar246._2_2_ + sVar227;
          auVar214._4_2_ = auVar246._4_2_ + sVar121;
          auVar214._6_2_ = auVar246._6_2_ + sVar228;
          auVar214._8_2_ = auVar246._8_2_ + sVar229;
          auVar214._10_2_ = auVar246._10_2_ + sVar230;
          auVar214._12_2_ = auVar246._12_2_ + sVar231;
          auVar214._14_2_ = auVar246._14_2_ + sVar232;
          auVar143._0_2_ = auVar178._0_2_ + sVar119;
          auVar143._2_2_ = auVar178._2_2_ + sVar227;
          auVar143._4_2_ = auVar178._4_2_ + sVar121;
          auVar143._6_2_ = auVar178._6_2_ + sVar228;
          auVar143._8_2_ = auVar178._8_2_ + sVar229;
          auVar143._10_2_ = auVar178._10_2_ + sVar230;
          auVar143._12_2_ = auVar178._12_2_ + sVar231;
          auVar143._14_2_ = auVar178._14_2_ + sVar232;
          auVar162._0_2_ = auVar191._0_2_ + sVar119;
          auVar162._2_2_ = auVar191._2_2_ + sVar227;
          auVar162._4_2_ = auVar191._4_2_ + sVar121;
          auVar162._6_2_ = auVar191._6_2_ + sVar228;
          auVar162._8_2_ = auVar191._8_2_ + sVar229;
          auVar162._10_2_ = auVar191._10_2_ + sVar230;
          auVar162._12_2_ = auVar191._12_2_ + sVar231;
          auVar162._14_2_ = auVar191._14_2_ + sVar232;
          auVar236._0_2_ = auVar235._0_2_ + sVar119;
          auVar236._2_2_ = auVar235._2_2_ + sVar227;
          auVar236._4_2_ = auVar235._4_2_ + sVar121;
          auVar236._6_2_ = auVar235._6_2_ + sVar228;
          auVar236._8_2_ = auVar235._8_2_ + sVar229;
          auVar236._10_2_ = auVar235._10_2_ + sVar230;
          auVar236._12_2_ = auVar235._12_2_ + sVar231;
          auVar236._14_2_ = auVar235._14_2_ + sVar232;
          auVar246 = psraw(auVar214,5);
          auVar178 = psraw(auVar143,5);
          auVar191 = psraw(auVar162,5);
          sVar119 = auVar246._0_2_;
          sVar121 = auVar246._2_2_;
          sVar229 = auVar246._4_2_;
          sVar231 = auVar246._6_2_;
          sVar12 = auVar246._8_2_;
          sVar16 = auVar246._10_2_;
          sVar20 = auVar246._12_2_;
          sVar227 = auVar246._14_2_;
          cVar3 = (0 < sVar227) * (sVar227 < 0x100) * auVar246[0xe] - (0xff < sVar227);
          sVar26 = auVar191._0_2_;
          sVar30 = auVar191._2_2_;
          sVar34 = auVar191._4_2_;
          sVar39 = auVar191._6_2_;
          sVar47 = auVar191._8_2_;
          sVar55 = auVar191._10_2_;
          sVar42 = auVar191._12_2_;
          sVar50 = auVar191._14_2_;
          auVar235 = psraw(auVar236,5);
          sVar227 = auVar178._0_2_;
          sVar228 = auVar178._2_2_;
          sVar230 = auVar178._4_2_;
          sVar232 = auVar178._6_2_;
          sVar13 = auVar178._8_2_;
          sVar17 = auVar178._10_2_;
          sVar21 = auVar178._12_2_;
          sVar23 = auVar178._14_2_;
          sVar27 = auVar235._0_2_;
          sVar31 = auVar235._2_2_;
          sVar36 = auVar235._4_2_;
          sVar44 = auVar235._6_2_;
          sVar52 = auVar235._8_2_;
          sVar35 = auVar235._10_2_;
          sVar43 = auVar235._12_2_;
          sVar51 = auVar235._14_2_;
          uVar85 = CONCAT11((0 < sVar22) * (sVar22 < 0x100) * auVar249[0xe] - (0xff < sVar22),cVar2)
          ;
          uVar174 = CONCAT31(CONCAT21(uVar85,(0 < sVar19) * (sVar19 < 0x100) * auVar249[0xc] -
                                             (0xff < sVar19)),
                             (0 < sVar18) * (sVar18 < 0x100) * auVar225[0xc] - (0xff < sVar18));
          uVar84 = CONCAT51(CONCAT41(uVar174,(0 < sVar15) * (sVar15 < 0x100) * auVar249[10] -
                                             (0xff < sVar15)),
                            (0 < sVar14) * (sVar14 < 0x100) * auVar225[10] - (0xff < sVar14));
          Var82 = CONCAT72(CONCAT61(uVar84,(0 < sVar11) * (sVar11 < 0x100) * auVar249[8] -
                                           (0xff < sVar11)),
                           CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar225[8] - (0xff < sVar10),
                                    cVar2));
          Var69 = CONCAT91(CONCAT81((long)((unkuint9)Var82 >> 8),
                                    (0 < sVar9) * (sVar9 < 0x100) * auVar249[6] - (0xff < sVar9)),
                           (0 < sVar8) * (sVar8 < 0x100) * auVar225[6] - (0xff < sVar8));
          auVar68._2_10_ = Var69;
          auVar68[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar249[4] - (0xff < sVar7);
          auVar68[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar225[4] - (0xff < sVar6);
          auVar67._2_12_ = auVar68;
          auVar67[1] = (0 < sVar120) * (sVar120 < 0x100) * auVar249[2] - (0xff < sVar120);
          auVar67[0] = (0 < sVar5) * (sVar5 < 0x100) * auVar225[2] - (0xff < sVar5);
          auVar163._0_2_ =
               CONCAT11((0 < sVar117) * (sVar117 < 0x100) * auVar249[0] - (0xff < sVar117),
                        (0 < sVar4) * (sVar4 < 0x100) * auVar225[0] - (0xff < sVar4));
          auVar163._2_14_ = auVar67;
          uVar122 = CONCAT11((0 < sVar25) * (sVar25 < 0x100) * auVar195[0] - (0xff < sVar25),
                             (0 < sVar24) * (sVar24 < 0x100) * auVar234[0] - (0xff < sVar24));
          uVar154 = CONCAT13((0 < sVar29) * (sVar29 < 0x100) * auVar195[2] - (0xff < sVar29),
                             CONCAT12((0 < sVar28) * (sVar28 < 0x100) * auVar234[2] -
                                      (0xff < sVar28),uVar122));
          uVar124 = CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar195[4] - (0xff < sVar33),
                             CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar234[4] -
                                      (0xff < sVar32),uVar154));
          uVar125 = CONCAT17((0 < sVar38) * (sVar38 < 0x100) * auVar195[6] - (0xff < sVar38),
                             CONCAT16((0 < sVar37) * (sVar37 < 0x100) * auVar234[6] -
                                      (0xff < sVar37),uVar124));
          auVar189._0_10_ =
               CONCAT19((0 < sVar46) * (sVar46 < 0x100) * auVar195[8] - (0xff < sVar46),
                        CONCAT18((0 < sVar45) * (sVar45 < 0x100) * auVar234[8] - (0xff < sVar45),
                                 uVar125));
          auVar189[10] = (0 < sVar53) * (sVar53 < 0x100) * auVar234[10] - (0xff < sVar53);
          auVar189[0xb] = (0 < sVar54) * (sVar54 < 0x100) * auVar195[10] - (0xff < sVar54);
          auVar190[0xc] = (0 < sVar40) * (sVar40 < 0x100) * auVar234[0xc] - (0xff < sVar40);
          auVar190._0_12_ = auVar189;
          auVar190[0xd] = (0 < sVar41) * (sVar41 < 0x100) * auVar195[0xc] - (0xff < sVar41);
          auVar194[0xe] = (0 < sVar48) * (sVar48 < 0x100) * auVar234[0xe] - (0xff < sVar48);
          auVar194._0_14_ = auVar190;
          auVar194[0xf] = (0 < sVar49) * (sVar49 < 0x100) * auVar195[0xe] - (0xff < sVar49);
          uVar88 = CONCAT11((0 < sVar23) * (sVar23 < 0x100) * auVar178[0xe] - (0xff < sVar23),cVar3)
          ;
          uVar87 = CONCAT31(CONCAT21(uVar88,(0 < sVar21) * (sVar21 < 0x100) * auVar178[0xc] -
                                            (0xff < sVar21)),
                            (0 < sVar20) * (sVar20 < 0x100) * auVar246[0xc] - (0xff < sVar20));
          uVar86 = CONCAT51(CONCAT41(uVar87,(0 < sVar17) * (sVar17 < 0x100) * auVar178[10] -
                                            (0xff < sVar17)),
                            (0 < sVar16) * (sVar16 < 0x100) * auVar246[10] - (0xff < sVar16));
          Var83 = CONCAT72(CONCAT61(uVar86,(0 < sVar13) * (sVar13 < 0x100) * auVar178[8] -
                                           (0xff < sVar13)),
                           CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar246[8] - (0xff < sVar12),
                                    cVar3));
          Var72 = CONCAT91(CONCAT81((long)((unkuint9)Var83 >> 8),
                                    (0 < sVar232) * (sVar232 < 0x100) * auVar178[6] -
                                    (0xff < sVar232)),
                           (0 < sVar231) * (sVar231 < 0x100) * auVar246[6] - (0xff < sVar231));
          auVar71._2_10_ = Var72;
          auVar71[1] = (0 < sVar230) * (sVar230 < 0x100) * auVar178[4] - (0xff < sVar230);
          auVar71[0] = (0 < sVar229) * (sVar229 < 0x100) * auVar246[4] - (0xff < sVar229);
          auVar70._2_12_ = auVar71;
          auVar70[1] = (0 < sVar228) * (sVar228 < 0x100) * auVar178[2] - (0xff < sVar228);
          auVar70[0] = (0 < sVar121) * (sVar121 < 0x100) * auVar246[2] - (0xff < sVar121);
          auVar184._0_2_ =
               CONCAT11((0 < sVar227) * (sVar227 < 0x100) * auVar178[0] - (0xff < sVar227),
                        (0 < sVar119) * (sVar119 < 0x100) * auVar246[0] - (0xff < sVar119));
          auVar184._2_14_ = auVar70;
          uVar153 = CONCAT11((0 < sVar27) * (sVar27 < 0x100) * auVar235[0] - (0xff < sVar27),
                             (0 < sVar26) * (sVar26 < 0x100) * auVar191[0] - (0xff < sVar26));
          uVar201 = CONCAT13((0 < sVar31) * (sVar31 < 0x100) * auVar235[2] - (0xff < sVar31),
                             CONCAT12((0 < sVar30) * (sVar30 < 0x100) * auVar191[2] -
                                      (0xff < sVar30),uVar153));
          uVar155 = CONCAT15((0 < sVar36) * (sVar36 < 0x100) * auVar235[4] - (0xff < sVar36),
                             CONCAT14((0 < sVar34) * (sVar34 < 0x100) * auVar191[4] -
                                      (0xff < sVar34),uVar201));
          uVar156 = CONCAT17((0 < sVar44) * (sVar44 < 0x100) * auVar235[6] - (0xff < sVar44),
                             CONCAT16((0 < sVar39) * (sVar39 < 0x100) * auVar191[6] -
                                      (0xff < sVar39),uVar155));
          auVar202._0_10_ =
               CONCAT19((0 < sVar52) * (sVar52 < 0x100) * auVar235[8] - (0xff < sVar52),
                        CONCAT18((0 < sVar47) * (sVar47 < 0x100) * auVar191[8] - (0xff < sVar47),
                                 uVar156));
          auVar202[10] = (0 < sVar55) * (sVar55 < 0x100) * auVar191[10] - (0xff < sVar55);
          auVar202[0xb] = (0 < sVar35) * (sVar35 < 0x100) * auVar235[10] - (0xff < sVar35);
          auVar204[0xc] = (0 < sVar42) * (sVar42 < 0x100) * auVar191[0xc] - (0xff < sVar42);
          auVar204._0_12_ = auVar202;
          auVar204[0xd] = (0 < sVar43) * (sVar43 < 0x100) * auVar235[0xc] - (0xff < sVar43);
          auVar215[0xe] = (0 < sVar50) * (sVar50 < 0x100) * auVar191[0xe] - (0xff < sVar50);
          auVar215._0_14_ = auVar204;
          auVar215[0xf] = (0 < sVar51) * (sVar51 < 0x100) * auVar235[0xe] - (0xff < sVar51);
          auVar147._0_12_ = auVar163._0_12_;
          auVar147._12_2_ = (short)Var69;
          auVar147._14_2_ = (short)((ulong)uVar125 >> 0x30);
          auVar146._12_4_ = auVar147._12_4_;
          auVar146._0_10_ = auVar163._0_10_;
          auVar146._10_2_ = (short)((uint6)uVar124 >> 0x20);
          auVar145._10_6_ = auVar146._10_6_;
          auVar145._0_8_ = auVar163._0_8_;
          auVar145._8_2_ = auVar68._0_2_;
          auVar73._4_8_ = auVar145._8_8_;
          auVar73._2_2_ = (short)((uint)uVar154 >> 0x10);
          auVar73._0_2_ = auVar67._0_2_;
          auVar144._0_4_ = CONCAT22(uVar122,auVar163._0_2_);
          auVar144._4_12_ = auVar73;
          auVar221._0_12_ = auVar184._0_12_;
          auVar221._12_2_ = (short)Var72;
          auVar221._14_2_ = (short)((ulong)uVar156 >> 0x30);
          auVar220._12_4_ = auVar221._12_4_;
          auVar220._0_10_ = auVar184._0_10_;
          auVar220._10_2_ = (short)((uint6)uVar155 >> 0x20);
          auVar219._10_6_ = auVar220._10_6_;
          auVar219._0_8_ = auVar184._0_8_;
          auVar219._8_2_ = auVar71._0_2_;
          auVar74._4_8_ = auVar219._8_8_;
          auVar74._2_2_ = (short)((uint)uVar201 >> 0x10);
          auVar74._0_2_ = auVar70._0_2_;
          auVar237._0_8_ = auVar144._0_8_;
          auVar237._8_4_ = auVar73._0_4_;
          auVar237._12_4_ = auVar74._0_4_;
          *(ulong *)pUVar92 = CONCAT44(CONCAT22(uVar153,auVar184._0_2_),auVar144._0_4_);
          *(long *)(pUVar92 + -lVar90) = auVar237._8_8_;
          *(int *)(pUVar92 + lVar90 * -2) = auVar145._8_4_;
          *(int *)(pUVar92 + lVar90 * -2 + 4) = auVar219._8_4_;
          *(undefined4 *)(pUVar92 + lVar90 * -3 + 8) = auVar146._12_4_;
          *(undefined4 *)(pUVar92 + lVar90 * -3 + 0xc) = auVar220._12_4_;
          uVar154 = CONCAT22((short)((unkuint10)auVar189._0_10_ >> 0x40),
                             (short)((unkuint9)Var82 >> 8));
          auVar157._0_8_ = CONCAT26(auVar189._10_2_,CONCAT24((short)uVar84,uVar154));
          auVar157._8_2_ = (short)uVar174;
          auVar157._10_2_ = auVar190._12_2_;
          auVar164._12_2_ = uVar85;
          auVar164._0_12_ = auVar157;
          auVar164._14_2_ = auVar194._14_2_;
          uVar174 = CONCAT22((short)((unkuint10)auVar202._0_10_ >> 0x40),
                             (short)((unkuint9)Var83 >> 8));
          auVar175._0_8_ = CONCAT26(auVar202._10_2_,CONCAT24((short)uVar86,uVar174));
          auVar175._8_2_ = (short)uVar87;
          auVar175._10_2_ = auVar204._12_2_;
          auVar185._12_2_ = uVar88;
          auVar185._0_12_ = auVar175;
          auVar185._14_2_ = auVar215._14_2_;
          auVar148._8_4_ = (int)((ulong)auVar157._0_8_ >> 0x20);
          auVar148._0_8_ = auVar157._0_8_;
          auVar148._12_4_ = (int)((ulong)auVar175._0_8_ >> 0x20);
          *(ulong *)(pUVar92 + lVar90 * -4) = CONCAT44(uVar174,uVar154);
          *(long *)(pUVar92 + lVar90 * -5) = auVar148._8_8_;
          *(int *)(pUVar92 + lVar90 * -6) = auVar157._8_4_;
          *(int *)(pUVar92 + lVar90 * -6 + 4) = auVar175._8_4_;
          *(int *)(pUVar92 + lVar90 * -7 + 8) = auVar164._12_4_;
          *(int *)(pUVar92 + lVar90 * -7 + 0xc) = auVar185._12_4_;
          uVar95 = uVar95 + 8;
          pUVar93 = pUVar93 + -8;
          pUVar92 = pUVar92 + lVar90 * 8;
        } while (uVar95 < (uint)nt);
        uVar94 = uVar94 + 8;
        pUVar91 = pUVar91 + 8;
        auVar130._2_2_ = auVar130._2_2_ + 8;
        auVar130._0_2_ = sVar97 + 8;
        auVar130._4_2_ = sVar113 + 8;
        auVar130._6_2_ = sVar116 + 8;
        auVar130._8_2_ = sVar118 + 8;
        auVar130._10_2_ = sVar114 + 8;
        auVar130._12_2_ = sVar115 + 8;
        auVar130._14_2_ = sVar172 + 8;
      } while (uVar94 < (uint)nt);
    }
  }
  else if (nt == 4) {
    auVar129._4_4_ = uVar1;
    auVar129._0_4_ = uVar1;
    auVar129._8_4_ = uVar1;
    auVar129._12_4_ = uVar1;
    auVar130 = pmulld(auVar129,_DAT_00172e30);
    auVar177 = pmovsxbd(in_XMM3,0x1e1f1e1f);
    auVar177 = auVar177 & auVar130;
    auVar131._0_4_ = auVar130._0_4_ >> 5;
    auVar131._4_4_ = auVar130._4_4_ >> 5;
    auVar131._8_4_ = auVar130._8_4_ >> 5;
    auVar131._12_4_ = auVar130._12_4_ >> 5;
    auVar130 = pmovsxbd(auVar131,0x20202020);
    auVar132._0_4_ = auVar130._0_4_ - auVar177._0_4_;
    auVar132._4_4_ = auVar130._4_4_ - auVar177._4_4_;
    auVar132._8_4_ = auVar130._8_4_ - auVar177._8_4_;
    auVar132._12_4_ = auVar130._12_4_ - auVar177._12_4_;
    auVar130 = psllw(auVar177,8);
    auVar205 = psllw(auVar132,8);
    auVar130 = auVar130 | auVar177;
    auVar205 = auVar205 | auVar132;
    uVar152 = CONCAT13(auVar130[9],CONCAT12(auVar205[9],CONCAT11(auVar130[8],auVar205[8])));
    uVar123 = CONCAT13(auVar130[0xd],CONCAT12(auVar205[0xd],CONCAT11(auVar130[0xc],auVar205[0xc])));
    auVar213._0_14_ = auVar205._0_14_;
    auVar213[0xe] = auVar205[7];
    auVar213[0xf] = auVar130[7];
    auVar212._14_2_ = auVar213._14_2_;
    auVar212._0_13_ = auVar205._0_13_;
    auVar212[0xd] = auVar130[6];
    auVar211._13_3_ = auVar212._13_3_;
    auVar211._0_12_ = auVar205._0_12_;
    auVar211[0xc] = auVar205[6];
    auVar210._12_4_ = auVar211._12_4_;
    auVar210._0_11_ = auVar205._0_11_;
    auVar210[0xb] = auVar130[5];
    auVar209._11_5_ = auVar210._11_5_;
    auVar209._0_10_ = auVar205._0_10_;
    auVar209[10] = auVar205[5];
    auVar208._10_6_ = auVar209._10_6_;
    auVar208._0_9_ = auVar205._0_9_;
    auVar208[9] = auVar130[4];
    auVar207._9_7_ = auVar208._9_7_;
    auVar207._0_8_ = auVar205._0_8_;
    auVar207[8] = auVar205[4];
    auVar64._1_8_ = auVar207._8_8_;
    auVar64[0] = auVar130[3];
    auVar64._9_7_ = 0;
    auVar63._10_6_ = 0;
    auVar63._0_10_ = SUB1610(auVar64 << 0x38,6);
    auVar62._11_5_ = 0;
    auVar62._0_11_ = SUB1611(auVar63 << 0x30,5);
    auVar206._4_12_ = SUB1612(auVar62 << 0x28,4);
    auVar206[3] = auVar130[1];
    auVar206[2] = auVar205[1];
    auVar206[0] = auVar205[0];
    auVar206[1] = auVar130[0];
    auVar130 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(4 - auVar131._0_4_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar205 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(4 - auVar131._4_4_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar191 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(4 - auVar131._8_4_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar178 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(4 - auVar131._12_4_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    uVar151 = auVar206._0_4_;
    uVar98 = auVar207._8_4_;
    auVar100._4_4_ = uVar151;
    auVar100._0_4_ = uVar151;
    auVar100._8_4_ = uVar151;
    auVar100._12_4_ = uVar151;
    auVar177 = pmaddubsw(auVar130,auVar100);
    auVar101._4_4_ = uVar98;
    auVar101._0_4_ = uVar98;
    auVar101._8_4_ = uVar98;
    auVar101._12_4_ = uVar98;
    auVar205 = pmaddubsw(auVar205,auVar101);
    auVar102._4_4_ = uVar152;
    auVar102._0_4_ = uVar152;
    auVar102._8_4_ = uVar152;
    auVar102._12_4_ = uVar152;
    auVar191 = pmaddubsw(auVar191,auVar102);
    auVar103._4_4_ = uVar123;
    auVar103._0_4_ = uVar123;
    auVar103._8_4_ = uVar123;
    auVar103._12_4_ = uVar123;
    auVar178 = pmaddubsw(auVar178,auVar103);
    auVar130 = pmovsxbw(auVar103,0x1010101010101010);
    sVar96 = auVar130._0_2_;
    auVar133._0_2_ = auVar177._0_2_ + sVar96;
    sVar112 = auVar130._2_2_;
    auVar133._2_2_ = auVar177._2_2_ + sVar112;
    sVar97 = auVar130._4_2_;
    auVar133._4_2_ = auVar177._4_2_ + sVar97;
    sVar113 = auVar130._6_2_;
    auVar133._6_2_ = auVar177._6_2_ + sVar113;
    sVar116 = auVar130._8_2_;
    auVar133._8_2_ = auVar177._8_2_ + sVar116;
    sVar118 = auVar130._10_2_;
    auVar133._10_2_ = auVar177._10_2_ + sVar118;
    sVar114 = auVar130._12_2_;
    auVar133._12_2_ = auVar177._12_2_ + sVar114;
    sVar115 = auVar130._14_2_;
    auVar133._14_2_ = auVar177._14_2_ + sVar115;
    auVar160._0_2_ = auVar205._0_2_ + sVar96;
    auVar160._2_2_ = auVar205._2_2_ + sVar112;
    auVar160._4_2_ = auVar205._4_2_ + sVar97;
    auVar160._6_2_ = auVar205._6_2_ + sVar113;
    auVar160._8_2_ = auVar205._8_2_ + sVar116;
    auVar160._10_2_ = auVar205._10_2_ + sVar118;
    auVar160._12_2_ = auVar205._12_2_ + sVar114;
    auVar160._14_2_ = auVar205._14_2_ + sVar115;
    auVar192._0_2_ = auVar191._0_2_ + sVar96;
    auVar192._2_2_ = auVar191._2_2_ + sVar112;
    auVar192._4_2_ = auVar191._4_2_ + sVar97;
    auVar192._6_2_ = auVar191._6_2_ + sVar113;
    auVar192._8_2_ = auVar191._8_2_ + sVar116;
    auVar192._10_2_ = auVar191._10_2_ + sVar118;
    auVar192._12_2_ = auVar191._12_2_ + sVar114;
    auVar192._14_2_ = auVar191._14_2_ + sVar115;
    auVar179._0_2_ = auVar178._0_2_ + sVar96;
    auVar179._2_2_ = auVar178._2_2_ + sVar112;
    auVar179._4_2_ = auVar178._4_2_ + sVar97;
    auVar179._6_2_ = auVar178._6_2_ + sVar113;
    auVar179._8_2_ = auVar178._8_2_ + sVar116;
    auVar179._10_2_ = auVar178._10_2_ + sVar118;
    auVar179._12_2_ = auVar178._12_2_ + sVar114;
    auVar179._14_2_ = auVar178._14_2_ + sVar115;
    auVar130 = psraw(auVar133,5);
    auVar177 = psraw(auVar160,5);
    auVar205 = psraw(auVar192,5);
    sVar96 = auVar130._0_2_;
    sVar112 = auVar130._2_2_;
    auVar134[1] = (0 < sVar112) * (sVar112 < 0x100) * auVar130[2] - (0xff < sVar112);
    auVar134[0] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[0] - (0xff < sVar96);
    sVar96 = auVar130._4_2_;
    auVar134[2] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[4] - (0xff < sVar96);
    sVar96 = auVar130._6_2_;
    auVar134[3] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[6] - (0xff < sVar96);
    sVar96 = auVar130._8_2_;
    auVar134[4] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[8] - (0xff < sVar96);
    sVar96 = auVar130._10_2_;
    auVar134[5] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[10] - (0xff < sVar96);
    sVar96 = auVar130._12_2_;
    auVar134[6] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[0xc] - (0xff < sVar96);
    sVar96 = auVar130._14_2_;
    auVar134[7] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[0xe] - (0xff < sVar96);
    sVar96 = auVar205._0_2_;
    auVar134[8] = (0 < sVar96) * (sVar96 < 0x100) * auVar205[0] - (0xff < sVar96);
    sVar96 = auVar205._2_2_;
    auVar134[9] = (0 < sVar96) * (sVar96 < 0x100) * auVar205[2] - (0xff < sVar96);
    sVar96 = auVar205._4_2_;
    auVar134[10] = (0 < sVar96) * (sVar96 < 0x100) * auVar205[4] - (0xff < sVar96);
    sVar96 = auVar205._6_2_;
    auVar134[0xb] = (0 < sVar96) * (sVar96 < 0x100) * auVar205[6] - (0xff < sVar96);
    sVar96 = auVar205._8_2_;
    auVar134[0xc] = (0 < sVar96) * (sVar96 < 0x100) * auVar205[8] - (0xff < sVar96);
    sVar96 = auVar205._10_2_;
    auVar134[0xd] = (0 < sVar96) * (sVar96 < 0x100) * auVar205[10] - (0xff < sVar96);
    sVar96 = auVar205._12_2_;
    auVar134[0xe] = (0 < sVar96) * (sVar96 < 0x100) * auVar205[0xc] - (0xff < sVar96);
    sVar96 = auVar205._14_2_;
    auVar134[0xf] = (0 < sVar96) * (sVar96 < 0x100) * auVar205[0xe] - (0xff < sVar96);
    auVar130 = psraw(auVar179,5);
    sVar96 = auVar177._0_2_;
    sVar112 = auVar177._2_2_;
    auVar161[1] = (0 < sVar112) * (sVar112 < 0x100) * auVar177[2] - (0xff < sVar112);
    auVar161[0] = (0 < sVar96) * (sVar96 < 0x100) * auVar177[0] - (0xff < sVar96);
    sVar96 = auVar177._4_2_;
    auVar161[2] = (0 < sVar96) * (sVar96 < 0x100) * auVar177[4] - (0xff < sVar96);
    sVar96 = auVar177._6_2_;
    auVar161[3] = (0 < sVar96) * (sVar96 < 0x100) * auVar177[6] - (0xff < sVar96);
    sVar96 = auVar177._8_2_;
    auVar161[4] = (0 < sVar96) * (sVar96 < 0x100) * auVar177[8] - (0xff < sVar96);
    sVar96 = auVar177._10_2_;
    auVar161[5] = (0 < sVar96) * (sVar96 < 0x100) * auVar177[10] - (0xff < sVar96);
    sVar96 = auVar177._12_2_;
    auVar161[6] = (0 < sVar96) * (sVar96 < 0x100) * auVar177[0xc] - (0xff < sVar96);
    sVar96 = auVar177._14_2_;
    auVar161[7] = (0 < sVar96) * (sVar96 < 0x100) * auVar177[0xe] - (0xff < sVar96);
    sVar96 = auVar130._0_2_;
    auVar161[8] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[0] - (0xff < sVar96);
    sVar96 = auVar130._2_2_;
    auVar161[9] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[2] - (0xff < sVar96);
    sVar96 = auVar130._4_2_;
    auVar161[10] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[4] - (0xff < sVar96);
    sVar96 = auVar130._6_2_;
    auVar161[0xb] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[6] - (0xff < sVar96);
    sVar96 = auVar130._8_2_;
    auVar161[0xc] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[8] - (0xff < sVar96);
    sVar96 = auVar130._10_2_;
    auVar161[0xd] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[10] - (0xff < sVar96);
    sVar96 = auVar130._12_2_;
    auVar161[0xe] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[0xc] - (0xff < sVar96);
    sVar96 = auVar130._14_2_;
    auVar161[0xf] = (0 < sVar96) * (sVar96 < 0x100) * auVar130[0xe] - (0xff < sVar96);
    auVar177 = pshufb(auVar161,ZEXT816(0xb030a0209010800));
    auVar130 = pshufb(auVar134,ZEXT816(0xb030a0209010800));
    auVar142._0_14_ = auVar130._0_14_;
    auVar142[0xe] = auVar130[7];
    auVar142[0xf] = auVar177[7];
    auVar141._14_2_ = auVar142._14_2_;
    auVar141._0_13_ = auVar130._0_13_;
    auVar141[0xd] = auVar177[6];
    auVar140._13_3_ = auVar141._13_3_;
    auVar140._0_12_ = auVar130._0_12_;
    auVar140[0xc] = auVar130[6];
    auVar139._12_4_ = auVar140._12_4_;
    auVar139._0_11_ = auVar130._0_11_;
    auVar139[0xb] = auVar177[5];
    auVar138._11_5_ = auVar139._11_5_;
    auVar138._0_10_ = auVar130._0_10_;
    auVar138[10] = auVar130[5];
    auVar137._10_6_ = auVar138._10_6_;
    auVar137._0_9_ = auVar130._0_9_;
    auVar137[9] = auVar177[4];
    auVar136._9_7_ = auVar137._9_7_;
    auVar136._0_8_ = auVar130._0_8_;
    auVar136[8] = auVar130[4];
    auVar65._4_8_ = auVar136._8_8_;
    auVar65[3] = auVar177[3];
    auVar65[2] = auVar130[3];
    auVar65[1] = auVar177[2];
    auVar65[0] = auVar130[2];
    auVar135._4_12_ = auVar65;
    auVar135[3] = auVar177[1];
    auVar135[2] = auVar130[1];
    auVar135[0] = auVar130[0];
    auVar135[1] = auVar177[0];
    *(undefined4 *)pu1_dst = auVar139._12_4_;
    lVar90 = (long)dst_strd;
    *(int *)(pu1_dst + lVar90) = auVar136._8_4_;
    *(int *)(pu1_dst + lVar90 * 2) = auVar65._0_4_;
    *(int *)(pu1_dst + lVar90 * 3) = auVar135._0_4_;
  }
  else {
    auVar130 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0);
    auVar177 = pshuflw(ZEXT416((uint)nt),ZEXT416((uint)nt),0);
    auVar165._0_2_ = auVar130._0_2_;
    sVar96 = auVar130._2_2_;
    auVar165._2_2_ = sVar96 * 2;
    auVar165._4_2_ = auVar165._0_2_ * 3;
    auVar165._6_2_ = sVar96 * 4;
    auVar165._8_2_ = auVar165._0_2_ * 5;
    auVar165._10_2_ = sVar96 * 6;
    auVar165._12_2_ = auVar165._0_2_ * 7;
    auVar165._14_2_ = sVar96 * 8;
    auVar178 = pmovsxbw(in_XMM3,0x1c1f1e1f1c1f1e1f);
    auVar178 = auVar178 & auVar165;
    auVar205 = psraw(auVar165,5);
    sVar96 = auVar177._0_2_;
    sVar112 = auVar177._2_2_;
    auVar130 = pmovsxbw(auVar205,0x2020202020202020);
    auVar166._0_2_ = auVar130._0_2_ - auVar178._0_2_;
    auVar166._2_2_ = auVar130._2_2_ - auVar178._2_2_;
    auVar166._4_2_ = auVar130._4_2_ - auVar178._4_2_;
    auVar166._6_2_ = auVar130._6_2_ - auVar178._6_2_;
    auVar166._8_2_ = auVar130._8_2_ - auVar178._8_2_;
    auVar166._10_2_ = auVar130._10_2_ - auVar178._10_2_;
    auVar166._12_2_ = auVar130._12_2_ - auVar178._12_2_;
    auVar166._14_2_ = auVar130._14_2_ - auVar178._14_2_;
    auVar130 = psllw(auVar178,8);
    auVar177 = psllw(auVar166,8);
    auVar130 = auVar130 | auVar178;
    auVar177 = auVar177 | auVar166;
    uVar123 = CONCAT13(auVar130[9],CONCAT12(auVar177[9],CONCAT11(auVar130[8],auVar177[8])));
    auVar203._0_8_ =
         CONCAT17(auVar130[0xb],
                  CONCAT16(auVar177[0xb],CONCAT15(auVar130[10],CONCAT14(auVar177[10],uVar123))));
    auVar203[8] = auVar177[0xc];
    auVar203[9] = auVar130[0xc];
    auVar203[10] = auVar177[0xd];
    auVar203[0xb] = auVar130[0xd];
    auVar216[0xc] = auVar177[0xe];
    auVar216._0_12_ = auVar203;
    auVar216[0xd] = auVar130[0xe];
    auVar216[0xe] = auVar177[0xf];
    auVar216[0xf] = auVar130[0xf];
    auVar245._0_14_ = auVar177._0_14_;
    auVar245[0xe] = auVar177[7];
    auVar245[0xf] = auVar130[7];
    auVar244._14_2_ = auVar245._14_2_;
    auVar244._0_13_ = auVar177._0_13_;
    auVar244[0xd] = auVar130[6];
    auVar243._13_3_ = auVar244._13_3_;
    auVar243._0_12_ = auVar177._0_12_;
    auVar243[0xc] = auVar177[6];
    auVar242._12_4_ = auVar243._12_4_;
    auVar242._0_11_ = auVar177._0_11_;
    auVar242[0xb] = auVar130[5];
    auVar241._11_5_ = auVar242._11_5_;
    auVar241._0_10_ = auVar177._0_10_;
    auVar241[10] = auVar177[5];
    auVar240._10_6_ = auVar241._10_6_;
    auVar240._0_9_ = auVar177._0_9_;
    auVar240[9] = auVar130[4];
    auVar239._9_7_ = auVar240._9_7_;
    auVar239._0_8_ = auVar177._0_8_;
    auVar239[8] = auVar177[4];
    auVar75._4_8_ = auVar239._8_8_;
    auVar75[3] = auVar130[3];
    auVar75[2] = auVar177[3];
    auVar75[1] = auVar130[2];
    auVar75[0] = auVar177[2];
    auVar238._4_12_ = auVar75;
    auVar238[3] = auVar130[1];
    auVar238[2] = auVar177[1];
    auVar238[0] = auVar177[0];
    auVar238[1] = auVar130[0];
    auVar178 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar96 - auVar205._0_2_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar191 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar112 - auVar205._2_2_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar249 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar96 - auVar205._4_2_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar246 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar112 - auVar205._6_2_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar130 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar96 - auVar205._8_2_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar195 = pshufb(*(undefined1 (*) [16])
                       (pu1_ref + (long)(short)(sVar112 - auVar205._10_2_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar225 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar96 - auVar205._12_2_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar222 = pshufb(*(undefined1 (*) [16])
                       (pu1_ref + (long)(short)(sVar112 - auVar205._14_2_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    uVar151 = auVar238._0_4_;
    uVar98 = auVar75._0_4_;
    uVar152 = auVar239._8_4_;
    auVar177._4_4_ = uVar151;
    auVar177._0_4_ = uVar151;
    auVar177._8_4_ = uVar151;
    auVar177._12_4_ = uVar151;
    auVar178 = pmaddubsw(auVar178,auVar177);
    auVar205._4_4_ = uVar98;
    auVar205._0_4_ = uVar98;
    auVar205._8_4_ = uVar98;
    auVar205._12_4_ = uVar98;
    auVar205 = pmaddubsw(auVar191,auVar205);
    auVar223._4_4_ = uVar152;
    auVar223._0_4_ = uVar152;
    auVar223._8_4_ = uVar152;
    auVar223._12_4_ = uVar152;
    auVar249 = pmaddubsw(auVar249,auVar223);
    auVar104._4_4_ = auVar242._12_4_;
    auVar104._0_4_ = auVar242._12_4_;
    auVar104._8_4_ = auVar242._12_4_;
    auVar104._12_4_ = auVar242._12_4_;
    auVar246 = pmaddubsw(auVar246,auVar104);
    uVar151 = (undefined4)((ulong)auVar203._0_8_ >> 0x20);
    uVar98 = auVar203._8_4_;
    uVar152 = auVar216._12_4_;
    auVar105._4_4_ = uVar123;
    auVar105._0_4_ = uVar123;
    auVar105._8_4_ = uVar123;
    auVar105._12_4_ = uVar123;
    auVar177 = pmaddubsw(auVar130,auVar105);
    auVar106._4_4_ = uVar151;
    auVar106._0_4_ = uVar151;
    auVar106._8_4_ = uVar151;
    auVar106._12_4_ = uVar151;
    auVar191 = pmaddubsw(auVar195,auVar106);
    auVar107._4_4_ = uVar98;
    auVar107._0_4_ = uVar98;
    auVar107._8_4_ = uVar98;
    auVar107._12_4_ = uVar98;
    auVar195 = pmaddubsw(auVar225,auVar107);
    auVar108._4_4_ = uVar152;
    auVar108._0_4_ = uVar152;
    auVar108._8_4_ = uVar152;
    auVar108._12_4_ = uVar152;
    auVar223 = pmaddubsw(auVar222,auVar108);
    auVar130 = pmovsxbw(auVar108,0x1010101010101010);
    sVar97 = auVar130._0_2_;
    auVar167._0_2_ = auVar178._0_2_ + sVar97;
    sVar113 = auVar130._2_2_;
    auVar167._2_2_ = auVar178._2_2_ + sVar113;
    sVar114 = auVar130._4_2_;
    auVar167._4_2_ = auVar178._4_2_ + sVar114;
    sVar115 = auVar130._6_2_;
    auVar167._6_2_ = auVar178._6_2_ + sVar115;
    sVar117 = auVar130._8_2_;
    auVar167._8_2_ = auVar178._8_2_ + sVar117;
    sVar119 = auVar130._10_2_;
    auVar167._10_2_ = auVar178._10_2_ + sVar119;
    sVar120 = auVar130._12_2_;
    auVar167._12_2_ = auVar178._12_2_ + sVar120;
    sVar121 = auVar130._14_2_;
    auVar167._14_2_ = auVar178._14_2_ + sVar121;
    auVar186._0_2_ = auVar205._0_2_ + sVar97;
    auVar186._2_2_ = auVar205._2_2_ + sVar113;
    auVar186._4_2_ = auVar205._4_2_ + sVar114;
    auVar186._6_2_ = auVar205._6_2_ + sVar115;
    auVar186._8_2_ = auVar205._8_2_ + sVar117;
    auVar186._10_2_ = auVar205._10_2_ + sVar119;
    auVar186._12_2_ = auVar205._12_2_ + sVar120;
    auVar186._14_2_ = auVar205._14_2_ + sVar121;
    auVar250._0_2_ = auVar249._0_2_ + sVar97;
    auVar250._2_2_ = auVar249._2_2_ + sVar113;
    auVar250._4_2_ = auVar249._4_2_ + sVar114;
    auVar250._6_2_ = auVar249._6_2_ + sVar115;
    auVar250._8_2_ = auVar249._8_2_ + sVar117;
    auVar250._10_2_ = auVar249._10_2_ + sVar119;
    auVar250._12_2_ = auVar249._12_2_ + sVar120;
    auVar250._14_2_ = auVar249._14_2_ + sVar121;
    auVar247._0_2_ = auVar246._0_2_ + sVar97;
    auVar247._2_2_ = auVar246._2_2_ + sVar113;
    auVar247._4_2_ = auVar246._4_2_ + sVar114;
    auVar247._6_2_ = auVar246._6_2_ + sVar115;
    auVar247._8_2_ = auVar246._8_2_ + sVar117;
    auVar247._10_2_ = auVar246._10_2_ + sVar119;
    auVar247._12_2_ = auVar246._12_2_ + sVar120;
    auVar247._14_2_ = auVar246._14_2_ + sVar121;
    auVar205 = psraw(auVar167,5);
    auVar178 = psraw(auVar186,5);
    auVar225 = psraw(auVar250,5);
    sVar96 = auVar205._0_2_;
    sVar116 = auVar205._2_2_;
    sVar172 = auVar205._4_2_;
    sVar227 = auVar205._6_2_;
    sVar228 = auVar205._8_2_;
    sVar230 = auVar205._10_2_;
    sVar232 = auVar205._12_2_;
    sVar112 = auVar205._14_2_;
    cVar2 = (0 < sVar112) * (sVar112 < 0x100) * auVar205[0xe] - (0xff < sVar112);
    sVar15 = auVar225._0_2_;
    sVar19 = auVar225._2_2_;
    sVar23 = auVar225._4_2_;
    sVar27 = auVar225._6_2_;
    sVar31 = auVar225._8_2_;
    sVar36 = auVar225._10_2_;
    sVar44 = auVar225._12_2_;
    sVar52 = auVar225._14_2_;
    auVar222 = psraw(auVar247,5);
    sVar112 = auVar178._0_2_;
    sVar118 = auVar178._2_2_;
    sVar4 = auVar178._4_2_;
    sVar5 = auVar178._6_2_;
    sVar6 = auVar178._8_2_;
    sVar8 = auVar178._10_2_;
    sVar10 = auVar178._12_2_;
    sVar13 = auVar178._14_2_;
    sVar16 = auVar222._0_2_;
    sVar20 = auVar222._2_2_;
    sVar24 = auVar222._4_2_;
    sVar28 = auVar222._6_2_;
    sVar32 = auVar222._8_2_;
    sVar37 = auVar222._10_2_;
    sVar45 = auVar222._12_2_;
    sVar53 = auVar222._14_2_;
    auVar149._0_2_ = auVar177._0_2_ + sVar97;
    auVar149._2_2_ = auVar177._2_2_ + sVar113;
    auVar149._4_2_ = auVar177._4_2_ + sVar114;
    auVar149._6_2_ = auVar177._6_2_ + sVar115;
    auVar149._8_2_ = auVar177._8_2_ + sVar117;
    auVar149._10_2_ = auVar177._10_2_ + sVar119;
    auVar149._12_2_ = auVar177._12_2_ + sVar120;
    auVar149._14_2_ = auVar177._14_2_ + sVar121;
    auVar196._0_2_ = auVar191._0_2_ + sVar97;
    auVar196._2_2_ = auVar191._2_2_ + sVar113;
    auVar196._4_2_ = auVar191._4_2_ + sVar114;
    auVar196._6_2_ = auVar191._6_2_ + sVar115;
    auVar196._8_2_ = auVar191._8_2_ + sVar117;
    auVar196._10_2_ = auVar191._10_2_ + sVar119;
    auVar196._12_2_ = auVar191._12_2_ + sVar120;
    auVar196._14_2_ = auVar191._14_2_ + sVar121;
    auVar226._0_2_ = auVar195._0_2_ + sVar97;
    auVar226._2_2_ = auVar195._2_2_ + sVar113;
    auVar226._4_2_ = auVar195._4_2_ + sVar114;
    auVar226._6_2_ = auVar195._6_2_ + sVar115;
    auVar226._8_2_ = auVar195._8_2_ + sVar117;
    auVar226._10_2_ = auVar195._10_2_ + sVar119;
    auVar226._12_2_ = auVar195._12_2_ + sVar120;
    auVar226._14_2_ = auVar195._14_2_ + sVar121;
    auVar224._0_2_ = auVar223._0_2_ + sVar97;
    auVar224._2_2_ = auVar223._2_2_ + sVar113;
    auVar224._4_2_ = auVar223._4_2_ + sVar114;
    auVar224._6_2_ = auVar223._6_2_ + sVar115;
    auVar224._8_2_ = auVar223._8_2_ + sVar117;
    auVar224._10_2_ = auVar223._10_2_ + sVar119;
    auVar224._12_2_ = auVar223._12_2_ + sVar120;
    auVar224._14_2_ = auVar223._14_2_ + sVar121;
    auVar130 = psraw(auVar149,5);
    auVar177 = psraw(auVar196,5);
    auVar223 = psraw(auVar226,5);
    sVar97 = auVar130._0_2_;
    sVar114 = auVar130._2_2_;
    sVar117 = auVar130._4_2_;
    sVar120 = auVar130._6_2_;
    sVar7 = auVar130._8_2_;
    sVar9 = auVar130._10_2_;
    sVar11 = auVar130._12_2_;
    sVar113 = auVar130._14_2_;
    cVar3 = (0 < sVar113) * (sVar113 < 0x100) * auVar130[0xe] - (0xff < sVar113);
    sVar17 = auVar223._0_2_;
    sVar21 = auVar223._2_2_;
    sVar25 = auVar223._4_2_;
    sVar29 = auVar223._6_2_;
    sVar33 = auVar223._8_2_;
    sVar38 = auVar223._10_2_;
    sVar46 = auVar223._12_2_;
    sVar54 = auVar223._14_2_;
    auVar191 = psraw(auVar224,5);
    sVar113 = auVar177._0_2_;
    sVar115 = auVar177._2_2_;
    sVar119 = auVar177._4_2_;
    sVar121 = auVar177._6_2_;
    sVar229 = auVar177._8_2_;
    sVar231 = auVar177._10_2_;
    sVar12 = auVar177._12_2_;
    sVar14 = auVar177._14_2_;
    sVar18 = auVar191._0_2_;
    sVar22 = auVar191._2_2_;
    sVar26 = auVar191._4_2_;
    sVar30 = auVar191._6_2_;
    sVar34 = auVar191._8_2_;
    sVar39 = auVar191._10_2_;
    sVar47 = auVar191._12_2_;
    sVar55 = auVar191._14_2_;
    uVar85 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar178[0xe] - (0xff < sVar13),cVar2);
    uVar123 = CONCAT31(CONCAT21(uVar85,(0 < sVar10) * (sVar10 < 0x100) * auVar178[0xc] -
                                       (0xff < sVar10)),
                       (0 < sVar232) * (sVar232 < 0x100) * auVar205[0xc] - (0xff < sVar232));
    uVar84 = CONCAT51(CONCAT41(uVar123,(0 < sVar8) * (sVar8 < 0x100) * auVar178[10] - (0xff < sVar8)
                              ),(0 < sVar230) * (sVar230 < 0x100) * auVar205[10] - (0xff < sVar230))
    ;
    Var82 = CONCAT72(CONCAT61(uVar84,(0 < sVar6) * (sVar6 < 0x100) * auVar178[8] - (0xff < sVar6)),
                     CONCAT11((0 < sVar228) * (sVar228 < 0x100) * auVar205[8] - (0xff < sVar228),
                              cVar2));
    Var69 = CONCAT91(CONCAT81((long)((unkuint9)Var82 >> 8),
                              (0 < sVar5) * (sVar5 < 0x100) * auVar178[6] - (0xff < sVar5)),
                     (0 < sVar227) * (sVar227 < 0x100) * auVar205[6] - (0xff < sVar227));
    auVar77._2_10_ = Var69;
    auVar77[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar178[4] - (0xff < sVar4);
    auVar77[0] = (0 < sVar172) * (sVar172 < 0x100) * auVar205[4] - (0xff < sVar172);
    auVar76._2_12_ = auVar77;
    auVar76[1] = (0 < sVar118) * (sVar118 < 0x100) * auVar178[2] - (0xff < sVar118);
    auVar76[0] = (0 < sVar116) * (sVar116 < 0x100) * auVar205[2] - (0xff < sVar116);
    auVar109._0_2_ =
         CONCAT11((0 < sVar112) * (sVar112 < 0x100) * auVar178[0] - (0xff < sVar112),
                  (0 < sVar96) * (sVar96 < 0x100) * auVar205[0] - (0xff < sVar96));
    auVar109._2_14_ = auVar76;
    uVar153 = CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar222[0] - (0xff < sVar16),
                       (0 < sVar15) * (sVar15 < 0x100) * auVar225[0] - (0xff < sVar15));
    uVar98 = CONCAT13((0 < sVar20) * (sVar20 < 0x100) * auVar222[2] - (0xff < sVar20),
                      CONCAT12((0 < sVar19) * (sVar19 < 0x100) * auVar225[2] - (0xff < sVar19),
                               uVar153));
    uVar155 = CONCAT15((0 < sVar24) * (sVar24 < 0x100) * auVar222[4] - (0xff < sVar24),
                       CONCAT14((0 < sVar23) * (sVar23 < 0x100) * auVar225[4] - (0xff < sVar23),
                                uVar98));
    uVar156 = CONCAT17((0 < sVar28) * (sVar28 < 0x100) * auVar222[6] - (0xff < sVar28),
                       CONCAT16((0 < sVar27) * (sVar27 < 0x100) * auVar225[6] - (0xff < sVar27),
                                uVar155));
    auVar158._0_10_ =
         CONCAT19((0 < sVar32) * (sVar32 < 0x100) * auVar222[8] - (0xff < sVar32),
                  CONCAT18((0 < sVar31) * (sVar31 < 0x100) * auVar225[8] - (0xff < sVar31),uVar156))
    ;
    auVar158[10] = (0 < sVar36) * (sVar36 < 0x100) * auVar225[10] - (0xff < sVar36);
    auVar158[0xb] = (0 < sVar37) * (sVar37 < 0x100) * auVar222[10] - (0xff < sVar37);
    auVar159[0xc] = (0 < sVar44) * (sVar44 < 0x100) * auVar225[0xc] - (0xff < sVar44);
    auVar159._0_12_ = auVar158;
    auVar159[0xd] = (0 < sVar45) * (sVar45 < 0x100) * auVar222[0xc] - (0xff < sVar45);
    auVar168[0xe] = (0 < sVar52) * (sVar52 < 0x100) * auVar225[0xe] - (0xff < sVar52);
    auVar168._0_14_ = auVar159;
    auVar168[0xf] = (0 < sVar53) * (sVar53 < 0x100) * auVar222[0xe] - (0xff < sVar53);
    uVar88 = CONCAT11((0 < sVar14) * (sVar14 < 0x100) * auVar177[0xe] - (0xff < sVar14),cVar3);
    uVar151 = CONCAT31(CONCAT21(uVar88,(0 < sVar12) * (sVar12 < 0x100) * auVar177[0xc] -
                                       (0xff < sVar12)),
                       (0 < sVar11) * (sVar11 < 0x100) * auVar130[0xc] - (0xff < sVar11));
    uVar86 = CONCAT51(CONCAT41(uVar151,(0 < sVar231) * (sVar231 < 0x100) * auVar177[10] -
                                       (0xff < sVar231)),
                      (0 < sVar9) * (sVar9 < 0x100) * auVar130[10] - (0xff < sVar9));
    Var83 = CONCAT72(CONCAT61(uVar86,(0 < sVar229) * (sVar229 < 0x100) * auVar177[8] -
                                     (0xff < sVar229)),
                     CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar130[8] - (0xff < sVar7),cVar3));
    Var72 = CONCAT91(CONCAT81((long)((unkuint9)Var83 >> 8),
                              (0 < sVar121) * (sVar121 < 0x100) * auVar177[6] - (0xff < sVar121)),
                     (0 < sVar120) * (sVar120 < 0x100) * auVar130[6] - (0xff < sVar120));
    auVar79._2_10_ = Var72;
    auVar79[1] = (0 < sVar119) * (sVar119 < 0x100) * auVar177[4] - (0xff < sVar119);
    auVar79[0] = (0 < sVar117) * (sVar117 < 0x100) * auVar130[4] - (0xff < sVar117);
    auVar78._2_12_ = auVar79;
    auVar78[1] = (0 < sVar115) * (sVar115 < 0x100) * auVar177[2] - (0xff < sVar115);
    auVar78[0] = (0 < sVar114) * (sVar114 < 0x100) * auVar130[2] - (0xff < sVar114);
    auVar187._0_2_ =
         CONCAT11((0 < sVar113) * (sVar113 < 0x100) * auVar177[0] - (0xff < sVar113),
                  (0 < sVar97) * (sVar97 < 0x100) * auVar130[0] - (0xff < sVar97));
    auVar187._2_14_ = auVar78;
    uVar122 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * auVar191[0] - (0xff < sVar18),
                       (0 < sVar17) * (sVar17 < 0x100) * auVar223[0] - (0xff < sVar17));
    uVar152 = CONCAT13((0 < sVar22) * (sVar22 < 0x100) * auVar191[2] - (0xff < sVar22),
                       CONCAT12((0 < sVar21) * (sVar21 < 0x100) * auVar223[2] - (0xff < sVar21),
                                uVar122));
    uVar124 = CONCAT15((0 < sVar26) * (sVar26 < 0x100) * auVar191[4] - (0xff < sVar26),
                       CONCAT14((0 < sVar25) * (sVar25 < 0x100) * auVar223[4] - (0xff < sVar25),
                                uVar152));
    uVar125 = CONCAT17((0 < sVar30) * (sVar30 < 0x100) * auVar191[6] - (0xff < sVar30),
                       CONCAT16((0 < sVar29) * (sVar29 < 0x100) * auVar223[6] - (0xff < sVar29),
                                uVar124));
    auVar127._0_10_ =
         CONCAT19((0 < sVar34) * (sVar34 < 0x100) * auVar191[8] - (0xff < sVar34),
                  CONCAT18((0 < sVar33) * (sVar33 < 0x100) * auVar223[8] - (0xff < sVar33),uVar125))
    ;
    auVar127[10] = (0 < sVar38) * (sVar38 < 0x100) * auVar223[10] - (0xff < sVar38);
    auVar127[0xb] = (0 < sVar39) * (sVar39 < 0x100) * auVar191[10] - (0xff < sVar39);
    auVar128[0xc] = (0 < sVar46) * (sVar46 < 0x100) * auVar223[0xc] - (0xff < sVar46);
    auVar128._0_12_ = auVar127;
    auVar128[0xd] = (0 < sVar47) * (sVar47 < 0x100) * auVar191[0xc] - (0xff < sVar47);
    auVar150[0xe] = (0 < sVar54) * (sVar54 < 0x100) * auVar223[0xe] - (0xff < sVar54);
    auVar150._0_14_ = auVar128;
    auVar150[0xf] = (0 < sVar55) * (sVar55 < 0x100) * auVar191[0xe] - (0xff < sVar55);
    auVar200._0_12_ = auVar109._0_12_;
    auVar200._12_2_ = (short)Var69;
    auVar200._14_2_ = (short)((ulong)uVar156 >> 0x30);
    auVar199._12_4_ = auVar200._12_4_;
    auVar199._0_10_ = auVar109._0_10_;
    auVar199._10_2_ = (short)((uint6)uVar155 >> 0x20);
    auVar198._10_6_ = auVar199._10_6_;
    auVar198._0_8_ = auVar109._0_8_;
    auVar198._8_2_ = auVar77._0_2_;
    auVar80._4_8_ = auVar198._8_8_;
    auVar80._2_2_ = (short)((uint)uVar98 >> 0x10);
    auVar80._0_2_ = auVar76._0_2_;
    auVar197._0_4_ = CONCAT22(uVar153,auVar109._0_2_);
    auVar197._4_12_ = auVar80;
    uVar98 = CONCAT22((short)((unkuint10)auVar158._0_10_ >> 0x40),(short)((unkuint9)Var82 >> 8));
    auVar99._0_8_ = CONCAT26(auVar158._10_2_,CONCAT24((short)uVar84,uVar98));
    auVar99._8_2_ = (short)uVar123;
    auVar99._10_2_ = auVar159._12_2_;
    auVar110._12_2_ = uVar85;
    auVar110._0_12_ = auVar99;
    auVar110._14_2_ = auVar168._14_2_;
    uVar123 = CONCAT22((short)((unkuint10)auVar127._0_10_ >> 0x40),(short)((unkuint9)Var83 >> 8));
    auVar176._0_8_ = CONCAT26(auVar127._10_2_,CONCAT24((short)uVar86,uVar123));
    auVar176._8_2_ = (short)uVar151;
    auVar176._10_2_ = auVar128._12_2_;
    auVar188._12_2_ = uVar88;
    auVar188._0_12_ = auVar176;
    auVar188._14_2_ = auVar150._14_2_;
    *(int *)(pu1_dst + 8) = auVar110._12_4_;
    *(int *)(pu1_dst + 0xc) = auVar188._12_4_;
    auVar171._0_12_ = auVar187._0_12_;
    auVar171._12_2_ = (short)Var72;
    auVar171._14_2_ = (short)((ulong)uVar125 >> 0x30);
    auVar170._12_4_ = auVar171._12_4_;
    auVar170._0_10_ = auVar187._0_10_;
    auVar170._10_2_ = (short)((uint6)uVar124 >> 0x20);
    auVar169._10_6_ = auVar170._10_6_;
    auVar169._0_8_ = auVar187._0_8_;
    auVar169._8_2_ = auVar79._0_2_;
    auVar81._4_8_ = auVar169._8_8_;
    auVar81._2_2_ = (short)((uint)uVar152 >> 0x10);
    auVar81._0_2_ = auVar78._0_2_;
    auVar217._8_4_ = (int)((ulong)auVar99._0_8_ >> 0x20);
    auVar217._0_8_ = auVar99._0_8_;
    auVar217._12_4_ = (int)((ulong)auVar176._0_8_ >> 0x20);
    lVar90 = (long)dst_strd;
    *(int *)(pu1_dst + lVar90) = auVar99._8_4_;
    *(int *)(pu1_dst + lVar90 + 4) = auVar176._8_4_;
    *(long *)(pu1_dst + lVar90 * 2) = auVar217._8_8_;
    *(ulong *)(pu1_dst + lVar90 * 3) = CONCAT44(uVar123,uVar98);
    *(undefined4 *)(pu1_dst + lVar90 * 4 + 8) = auVar199._12_4_;
    *(undefined4 *)(pu1_dst + lVar90 * 4 + 0xc) = auVar170._12_4_;
    auVar111._0_8_ = auVar197._0_8_;
    auVar111._8_4_ = auVar80._0_4_;
    auVar111._12_4_ = auVar81._0_4_;
    *(int *)(pu1_dst + lVar90 * 5) = auVar198._8_4_;
    *(int *)(pu1_dst + lVar90 * 5 + 4) = auVar169._8_4_;
    *(long *)(pu1_dst + lVar90 * 6) = auVar111._8_8_;
    *(ulong *)(pu1_dst + lVar90 * 7) = CONCAT44(CONCAT22(uVar122,auVar187._0_2_),auVar197._0_4_);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode_3_to_9_sse42(UWORD8 *pu1_ref,
                                             WORD32 src_strd,
                                             UWORD8 *pu1_dst,
                                             WORD32 dst_strd,
                                             WORD32 nt,
                                             WORD32 mode)
{
    WORD32 row, col;
    WORD32 two_nt = 2 * nt;
    WORD32 intra_pred_ang;


    __m128i const_temp_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i fract_4x32b, intra_pred_ang_4x32b;
    __m128i row_4x32b, two_nt_4x32b, ref_main_idx_4x32b, res_temp5_4x32b, sm3;
    UNUSED(src_strd);


    /* Intra Pred Angle according to the mode */
    intra_pred_ang = gai4_ihevc_ang_table[mode];

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    const_temp_4x32b  = _mm_set1_epi16(16);
    const_temp2_4x32b = _mm_set1_epi32(31);
    const_temp3_4x32b = _mm_set1_epi32(32);
    const_temp4_4x32b = _mm_set1_epi32(4);

    two_nt_4x32b = _mm_set1_epi32(two_nt - nt);


    sm3 = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASKY11[0]);

    /* intra_pred_ang = gai4_ihevc_ang_table[mode]; */
    intra_pred_ang_4x32b = _mm_set1_epi32(intra_pred_ang);

    row_4x32b = _mm_set_epi32(4, 3, 2, 1);

    if(nt == 4)
    {

        WORD32 ref_main_idx1, ref_main_idx2, ref_main_idx3, ref_main_idx4;
        int temp11, temp21, temp31, temp41;
        // WORD8  ai1_fract_temp_val[16], ai1_row_temp_val[16];

        __m128i fract1_8x16b, fract2_8x16b;
        __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;

        __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
        __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b; //, src_temp8_8x16b;
        __m128i ref_main_temp0, ref_main_temp1, ref_main_temp2;

        /* pos = ((row + 1) * intra_pred_ang); */
        res_temp5_4x32b  = _mm_mullo_epi32(row_4x32b, intra_pred_ang_4x32b);

        /* idx = pos >> 5; */
        fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

        /* fract = pos & (31); */
        ref_main_idx_4x32b = _mm_sub_epi32(two_nt_4x32b, _mm_srai_epi32(res_temp5_4x32b,  5));

        /*(32 - fract) */
        row_4x32b = _mm_sub_epi32(const_temp3_4x32b, fract_4x32b);

        fract1_8x16b = _mm_slli_epi16(fract_4x32b, 8);
        fract2_8x16b = _mm_slli_epi16(row_4x32b, 8);

        fract_4x32b = _mm_or_si128(fract_4x32b, fract1_8x16b);
        row_4x32b = _mm_or_si128(row_4x32b, fract2_8x16b); /*(32 - fract) */

        fract2_8x16b = _mm_unpackhi_epi8(row_4x32b, fract_4x32b);
        fract1_8x16b = _mm_unpacklo_epi8(row_4x32b, fract_4x32b);

        temp1_8x16b =  _mm_shuffle_epi32(fract1_8x16b, 0x00);
        temp2_8x16b =  _mm_shuffle_epi32(fract1_8x16b, 0xaa);
        temp3_8x16b =  _mm_shuffle_epi32(fract2_8x16b, 0x00);
        temp4_8x16b =  _mm_shuffle_epi32(fract2_8x16b, 0xaa);

        ref_main_temp0 = _mm_srli_si128(ref_main_idx_4x32b, 4);  /* next 32 bit values */
        ref_main_temp1 = _mm_srli_si128(ref_main_idx_4x32b, 8);  /* next 32 bit values */
        ref_main_temp2 = _mm_srli_si128(ref_main_idx_4x32b, 12); /* next 32 bit values */
        ref_main_idx1  = _mm_cvtsi128_si32(ref_main_idx_4x32b);    /* col=0*/
        ref_main_idx2  = _mm_cvtsi128_si32(ref_main_temp0);  /* col=1*/
        ref_main_idx3  = _mm_cvtsi128_si32(ref_main_temp1);  /* col=2*/
        ref_main_idx4  = _mm_cvtsi128_si32(ref_main_temp2);  /* col=3*/

        /* loding 8-bit 16 pixels */
        src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx1 - 1)); /* col=0*/
        src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx2 - 1)); /* col=1*/
        src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx3 - 1)); /* col=2*/
        src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx4 - 1)); /* col=3*/

        src_temp1_8x16b =  _mm_shuffle_epi8(src_temp1_8x16b, sm3); /* col=0*/
        src_temp2_8x16b =  _mm_shuffle_epi8(src_temp2_8x16b, sm3); /* col=1*/
        src_temp3_8x16b =  _mm_shuffle_epi8(src_temp3_8x16b, sm3); /* col=2*/
        src_temp4_8x16b =  _mm_shuffle_epi8(src_temp4_8x16b, sm3); /* col=3*/

        /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
        src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
        src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
        src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
        src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

        /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
        src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
        src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
        src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
        src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

        /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
        src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
        src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
        src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
        src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

        /* converting 16 bit to 8 bit */
        src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp3_8x16b); /* col=0*/
        src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, src_temp4_8x16b); /* col=1*/


        src_temp5_8x16b = _mm_unpacklo_epi8(src_temp1_8x16b, src_temp2_8x16b);
        src_temp6_8x16b = _mm_unpackhi_epi8(src_temp1_8x16b, src_temp2_8x16b);

        src_temp3_8x16b = _mm_unpacklo_epi16(src_temp5_8x16b, src_temp6_8x16b);
        src_temp2_8x16b = _mm_srli_si128(src_temp3_8x16b, 4);
        src_temp1_8x16b = _mm_srli_si128(src_temp3_8x16b, 8);
        src_temp7_8x16b = _mm_srli_si128(src_temp3_8x16b, 12);

        temp11 = _mm_cvtsi128_si32(src_temp7_8x16b);
        temp21 = _mm_cvtsi128_si32(src_temp1_8x16b);
        temp31 = _mm_cvtsi128_si32(src_temp2_8x16b);
        temp41 = _mm_cvtsi128_si32(src_temp3_8x16b);

        /* loding 4-bit 8 pixels values */
        *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp11;
        *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp21;
        *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp31;
        *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp41;

    }

    else if(nt == 16 || nt == 32)
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(8);
        const_temp3_4x32b = _mm_set1_epi16(32);
        two_nt_4x32b = _mm_set1_epi16(two_nt);

        for(col = 0; col < nt; col += 8)
        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD16 pi2_ref_main_idx5, pi2_ref_main_idx6, pi2_ref_main_idx7, pi2_ref_main_idx8;
            //WORD8  ai1_fract_temp0_val[16], ai1_fract_temp1_val[16];

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract8_8x16b;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;
            __m128i temp11_8x16b, temp12_8x16b, temp13_8x16b, temp14_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* idx = pos >> 5; */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            /*(32 - fract) */
            fract2_8x16b =  _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            fract1_8x16b = _mm_slli_epi16(fract_4x32b, 8);
            fract3_8x16b = _mm_slli_epi16(fract2_8x16b, 8); /*(32 - fract) */

            fract_4x32b = _mm_or_si128(fract_4x32b, fract1_8x16b);
            fract2_8x16b = _mm_or_si128(fract2_8x16b, fract3_8x16b); /*(32 - fract) */


            fract8_8x16b = _mm_unpackhi_epi8(fract2_8x16b, fract_4x32b);
            fract_4x32b = _mm_unpacklo_epi8(fract2_8x16b, fract_4x32b);

            temp1_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x00);
            temp2_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x55);
            temp3_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xaa);
            temp4_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xff);

            temp11_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x00);
            temp12_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x55);
            temp13_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xaa);
            temp14_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xff);

            /* fract = pos & (31); */
            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, _mm_srai_epi16(res_temp5_4x32b,  5));

            row_4x32b = _mm_add_epi16(row_4x32b, const_temp4_4x32b);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            pi2_ref_main_idx5 = _mm_extract_epi16(ref_main_idx_4x32b, 4);    /* col=5*/
            pi2_ref_main_idx6 = _mm_extract_epi16(ref_main_idx_4x32b, 5);    /* col=6*/
            pi2_ref_main_idx7 = _mm_extract_epi16(ref_main_idx_4x32b, 6);    /* col=7*/
            pi2_ref_main_idx8 = _mm_extract_epi16(ref_main_idx_4x32b, 7);    /* col=8*/

            for(row = 0; row < nt; row += 8)
            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;


                __m128i src_temp11_8x16b, src_temp12_8x16b, src_temp13_8x16b, src_temp14_8x16b;
                __m128i src_temp15_8x16b, src_temp16_8x16b, src_temp17_8x16b, src_temp18_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - 1 - (8 + row))); /* col=0*/
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - 1 - (8 + row))); /* col=1*/
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - 1 - (8 + row))); /* col=2*/
                src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - 1 - (8 + row))); /* col=3*/

                /* loding 8-bit 16 pixels */
                src_temp11_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx5 - 1 - (8 + row))); /* col=5*/
                src_temp12_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx6 - 1 - (8 + row))); /* col=6*/
                src_temp13_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx7 - 1 - (8 + row))); /* col=7*/
                src_temp14_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx8 - 1 - (8 + row))); /* col=8*/

                src_temp1_8x16b =  _mm_shuffle_epi8(src_temp1_8x16b, sm3); /* col=0*/
                src_temp2_8x16b =  _mm_shuffle_epi8(src_temp2_8x16b, sm3); /* col=1*/
                src_temp3_8x16b =  _mm_shuffle_epi8(src_temp3_8x16b, sm3); /* col=2*/
                src_temp4_8x16b =  _mm_shuffle_epi8(src_temp4_8x16b, sm3); /* col=3*/

                src_temp11_8x16b =  _mm_shuffle_epi8(src_temp11_8x16b, sm3); /* col=0*/
                src_temp12_8x16b =  _mm_shuffle_epi8(src_temp12_8x16b, sm3); /* col=1*/
                src_temp13_8x16b =  _mm_shuffle_epi8(src_temp13_8x16b, sm3); /* col=2*/
                src_temp14_8x16b =  _mm_shuffle_epi8(src_temp14_8x16b, sm3); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp11_8x16b = _mm_maddubs_epi16(src_temp11_8x16b, temp11_8x16b);
                src_temp12_8x16b = _mm_maddubs_epi16(src_temp12_8x16b, temp12_8x16b);
                src_temp13_8x16b = _mm_maddubs_epi16(src_temp13_8x16b, temp13_8x16b);
                src_temp14_8x16b = _mm_maddubs_epi16(src_temp14_8x16b, temp14_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp11_8x16b = _mm_add_epi16(src_temp11_8x16b, const_temp_4x32b);
                src_temp12_8x16b = _mm_add_epi16(src_temp12_8x16b, const_temp_4x32b);
                src_temp13_8x16b = _mm_add_epi16(src_temp13_8x16b, const_temp_4x32b);
                src_temp14_8x16b = _mm_add_epi16(src_temp14_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  5);   /* col=5*/
                src_temp12_8x16b = _mm_srai_epi16(src_temp12_8x16b,  5);   /* col=6*/
                src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  5);   /* col=7*/
                src_temp14_8x16b = _mm_srai_epi16(src_temp14_8x16b,  5);   /* col=8*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp3_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, src_temp4_8x16b); /* col=1*/

                /* converting 16 bit to 8 bit */
                src_temp11_8x16b = _mm_packus_epi16(src_temp11_8x16b, src_temp13_8x16b); /* col=5*/
                src_temp12_8x16b = _mm_packus_epi16(src_temp12_8x16b, src_temp14_8x16b); /* col=6*/

                src_temp5_8x16b = _mm_unpacklo_epi8(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpackhi_epi8(src_temp1_8x16b, src_temp2_8x16b);

                src_temp15_8x16b = _mm_unpacklo_epi8(src_temp11_8x16b, src_temp12_8x16b);
                src_temp16_8x16b = _mm_unpackhi_epi8(src_temp11_8x16b, src_temp12_8x16b);

                src_temp7_8x16b = _mm_unpacklo_epi16(src_temp5_8x16b, src_temp6_8x16b);
                src_temp8_8x16b = _mm_unpackhi_epi16(src_temp5_8x16b, src_temp6_8x16b);

                src_temp17_8x16b = _mm_unpacklo_epi16(src_temp15_8x16b, src_temp16_8x16b);
                src_temp18_8x16b = _mm_unpackhi_epi16(src_temp15_8x16b, src_temp16_8x16b);

                src_temp1_8x16b = _mm_unpacklo_epi32(src_temp7_8x16b, src_temp17_8x16b);
                src_temp2_8x16b = _mm_unpackhi_epi32(src_temp7_8x16b, src_temp17_8x16b);

                src_temp5_8x16b = _mm_srli_si128(src_temp1_8x16b, 8);
                src_temp6_8x16b = _mm_srli_si128(src_temp2_8x16b, 8);

                src_temp3_8x16b = _mm_unpacklo_epi32(src_temp8_8x16b, src_temp18_8x16b);
                src_temp4_8x16b = _mm_unpackhi_epi32(src_temp8_8x16b, src_temp18_8x16b);

                src_temp7_8x16b = _mm_srli_si128(src_temp3_8x16b, 8);
                src_temp8_8x16b = _mm_srli_si128(src_temp4_8x16b, 8);

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 7))), src_temp1_8x16b);          /* row=7*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 6))), src_temp5_8x16b);       /* row=6*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 5))), src_temp2_8x16b);       /* row=5*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 4))), src_temp6_8x16b);       /* row=4*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 3))), src_temp3_8x16b);       /* row=3*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 2))), src_temp7_8x16b);       /* row=2*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 1))), src_temp4_8x16b);       /* row=1*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 0))), src_temp8_8x16b);       /* row=0*/

            }
        }
    }
    else
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(8);
        const_temp3_4x32b = _mm_set1_epi16(32);
        two_nt_4x32b = _mm_set1_epi16(two_nt - nt);
        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD16 pi2_ref_main_idx5, pi2_ref_main_idx6, pi2_ref_main_idx7, pi2_ref_main_idx8;

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract8_8x16b;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;
            __m128i temp11_8x16b, temp12_8x16b, temp13_8x16b, temp14_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* idx = pos >> 5; */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            /* fract = pos & (31); */
            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, _mm_srai_epi16(res_temp5_4x32b,  5));

            /*(32 - fract) */
            fract2_8x16b =  _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            fract1_8x16b = _mm_slli_epi16(fract_4x32b, 8);
            fract3_8x16b = _mm_slli_epi16(fract2_8x16b, 8); /*(32 - fract) */

            fract_4x32b = _mm_or_si128(fract_4x32b, fract1_8x16b);
            fract2_8x16b = _mm_or_si128(fract2_8x16b, fract3_8x16b); /*(32 - fract) */


            fract8_8x16b = _mm_unpackhi_epi8(fract2_8x16b, fract_4x32b);
            fract_4x32b = _mm_unpacklo_epi8(fract2_8x16b, fract_4x32b);

            temp1_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x00);
            temp2_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x55);
            temp3_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xaa);
            temp4_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xff);

            temp11_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x00);
            temp12_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x55);
            temp13_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xaa);
            temp14_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xff);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            pi2_ref_main_idx5 = _mm_extract_epi16(ref_main_idx_4x32b, 4);    /* col=5*/
            pi2_ref_main_idx6 = _mm_extract_epi16(ref_main_idx_4x32b, 5);    /* col=6*/
            pi2_ref_main_idx7 = _mm_extract_epi16(ref_main_idx_4x32b, 6);    /* col=7*/
            pi2_ref_main_idx8 = _mm_extract_epi16(ref_main_idx_4x32b, 7);    /* col=8*/

            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

                __m128i src_temp11_8x16b, src_temp12_8x16b, src_temp13_8x16b, src_temp14_8x16b;
                __m128i src_temp15_8x16b, src_temp16_8x16b, src_temp17_8x16b, src_temp18_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - 1)); /* col=0*/
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - 1)); /* col=1*/
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - 1)); /* col=2*/
                src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - 1)); /* col=3*/

                /* loding 8-bit 16 pixels */
                src_temp11_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx5 - 1)); /* col=5*/
                src_temp12_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx6 - 1)); /* col=6*/
                src_temp13_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx7 - 1)); /* col=7*/
                src_temp14_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx8 - 1)); /* col=8*/

                src_temp1_8x16b =  _mm_shuffle_epi8(src_temp1_8x16b, sm3); /* col=0*/
                src_temp2_8x16b =  _mm_shuffle_epi8(src_temp2_8x16b, sm3); /* col=1*/
                src_temp3_8x16b =  _mm_shuffle_epi8(src_temp3_8x16b, sm3); /* col=2*/
                src_temp4_8x16b =  _mm_shuffle_epi8(src_temp4_8x16b, sm3); /* col=3*/

                src_temp11_8x16b =  _mm_shuffle_epi8(src_temp11_8x16b, sm3); /* col=0*/
                src_temp12_8x16b =  _mm_shuffle_epi8(src_temp12_8x16b, sm3); /* col=1*/
                src_temp13_8x16b =  _mm_shuffle_epi8(src_temp13_8x16b, sm3); /* col=2*/
                src_temp14_8x16b =  _mm_shuffle_epi8(src_temp14_8x16b, sm3); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp11_8x16b = _mm_maddubs_epi16(src_temp11_8x16b, temp11_8x16b);
                src_temp12_8x16b = _mm_maddubs_epi16(src_temp12_8x16b, temp12_8x16b);
                src_temp13_8x16b = _mm_maddubs_epi16(src_temp13_8x16b, temp13_8x16b);
                src_temp14_8x16b = _mm_maddubs_epi16(src_temp14_8x16b, temp14_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp11_8x16b = _mm_add_epi16(src_temp11_8x16b, const_temp_4x32b);
                src_temp12_8x16b = _mm_add_epi16(src_temp12_8x16b, const_temp_4x32b);
                src_temp13_8x16b = _mm_add_epi16(src_temp13_8x16b, const_temp_4x32b);
                src_temp14_8x16b = _mm_add_epi16(src_temp14_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  5);   /* col=5*/
                src_temp12_8x16b = _mm_srai_epi16(src_temp12_8x16b,  5);   /* col=6*/
                src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  5);   /* col=7*/
                src_temp14_8x16b = _mm_srai_epi16(src_temp14_8x16b,  5);   /* col=8*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp3_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, src_temp4_8x16b); /* col=1*/

                /* converting 16 bit to 8 bit */
                src_temp11_8x16b = _mm_packus_epi16(src_temp11_8x16b, src_temp13_8x16b); /* col=5*/
                src_temp12_8x16b = _mm_packus_epi16(src_temp12_8x16b, src_temp14_8x16b); /* col=6*/

                src_temp5_8x16b = _mm_unpacklo_epi8(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpackhi_epi8(src_temp1_8x16b, src_temp2_8x16b);

                src_temp15_8x16b = _mm_unpacklo_epi8(src_temp11_8x16b, src_temp12_8x16b);
                src_temp16_8x16b = _mm_unpackhi_epi8(src_temp11_8x16b, src_temp12_8x16b);

                src_temp7_8x16b = _mm_unpacklo_epi16(src_temp5_8x16b, src_temp6_8x16b);
                src_temp8_8x16b = _mm_unpackhi_epi16(src_temp5_8x16b, src_temp6_8x16b);

                src_temp17_8x16b = _mm_unpacklo_epi16(src_temp15_8x16b, src_temp16_8x16b);
                src_temp18_8x16b = _mm_unpackhi_epi16(src_temp15_8x16b, src_temp16_8x16b);

                src_temp1_8x16b = _mm_unpacklo_epi32(src_temp7_8x16b, src_temp17_8x16b);
                src_temp2_8x16b = _mm_unpackhi_epi32(src_temp7_8x16b, src_temp17_8x16b);

                src_temp5_8x16b = _mm_srli_si128(src_temp1_8x16b, 8);
                src_temp6_8x16b = _mm_srli_si128(src_temp2_8x16b, 8);

                src_temp3_8x16b = _mm_unpacklo_epi32(src_temp8_8x16b, src_temp18_8x16b);
                src_temp4_8x16b = _mm_unpackhi_epi32(src_temp8_8x16b, src_temp18_8x16b);

                src_temp7_8x16b = _mm_srli_si128(src_temp3_8x16b, 8);
                src_temp8_8x16b = _mm_srli_si128(src_temp4_8x16b, 8);

                _mm_storel_epi64((__m128i *)(pu1_dst), src_temp8_8x16b);       /* row=0*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 1)), src_temp4_8x16b);       /* row=1*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 2)), src_temp7_8x16b);       /* row=2*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 3)), src_temp3_8x16b);       /* row=3*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 4)), src_temp6_8x16b);       /* row=4*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 5)), src_temp2_8x16b);       /* row=5*/

                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 6)), src_temp5_8x16b);       /* row=6*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 7)), src_temp1_8x16b);          /* row=7*/

            }
        }
    }

}